

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O2

double __thiscall
KMaxDistance::compute
          (KMaxDistance *this,double *xEdgeCosts,double *yEdgeCosts,int width,int height,
          int numDistMaxs,int *srcPixs,int numSrcPixs,int dstPix,double *dists,int *backPtrs,
          double *maxVector)

{
  undefined8 *puVar1;
  size_t __size;
  double dVar2;
  double dVar3;
  int iVar4;
  void *pvVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  double dVar9;
  int iVar10;
  MaxRec **maxs;
  ulong uVar11;
  MaxRec *pMVar12;
  NodeAVL *pNVar13;
  undefined4 in_register_0000000c;
  void *pvVar14;
  int iVar15;
  int i;
  long lVar16;
  ulong uVar17;
  char *__ptr;
  uint uVar18;
  undefined1 auVar19 [64];
  size_t sStack_a0;
  NodeAVL *queue;
  ProbabEstimator *local_78;
  double local_70;
  int local_68;
  int local_64;
  long local_60;
  void *local_58;
  uint local_50;
  uint local_4c;
  double *local_48;
  double *local_40;
  ulong local_38;
  
  local_70 = (double)CONCAT44(in_register_0000000c,width);
  local_48 = xEdgeCosts;
  local_40 = yEdgeCosts;
  if (numDistMaxs < 0x29) {
    if (numDistMaxs < 1) {
      __ptr = "ERROR: numDistMaxs has to be positive.\n";
      sStack_a0 = 0x27;
    }
    else {
      if (0 < numSrcPixs) {
        uVar18 = height * width;
        this->numMaxRecs = 0;
        this->numMaxRecsInOneNode = 0;
        this->numDistMaxsGl = numDistMaxs;
        local_78 = (ProbabEstimator *)dists;
        __size = (long)(int)uVar18 * 8;
        local_64 = height;
        local_50 = uVar18;
        if (dists == (double *)0x0) {
          local_78 = (ProbabEstimator *)malloc(__size);
        }
        maxs = (MaxRec **)malloc(__size);
        local_58 = malloc((long)(int)uVar18 << 6);
        local_38 = (ulong)(~((int)uVar18 >> 0x1f) & uVar18);
        for (uVar11 = 0; local_38 != uVar11; uVar11 = uVar11 + 1) {
          maxs[uVar11] = (MaxRec *)0x0;
          *(undefined8 *)(&local_78->numMaxs + uVar11 * 2) = 0x4197d78400000000;
        }
        queue = (NodeAVL *)0x0;
        for (uVar11 = 0; (uint)numSrcPixs != uVar11; uVar11 = uVar11 + 1) {
          iVar4 = srcPixs[uVar11];
          pMVar12 = createNewMaxRec(this,iVar4,numDistMaxs);
          pMVar12->wasMin = 1;
          pNVar13 = avlInsert(&queue,0.0,pMVar12);
          pMVar12->qPtr = pNVar13;
          maxs[iVar4] = pMVar12;
          if (local_58 != (void *)0x0) {
            pvVar5 = pMVar12->back;
            uVar6 = *(undefined8 *)&pMVar12->isUsed;
            pNVar13 = pMVar12->qPtr;
            uVar7 = *(undefined8 *)&pMVar12->imgIdx;
            dVar2 = pMVar12->sumVals;
            uVar8 = *(undefined8 *)&pMVar12->numVals;
            dVar3 = pMVar12->vals[0];
            puVar1 = (undefined8 *)((long)local_58 + (long)iVar4 * 0x40);
            *puVar1 = pMVar12->next;
            puVar1[1] = pvVar5;
            puVar1[2] = uVar6;
            puVar1[3] = pNVar13;
            puVar1[4] = uVar7;
            puVar1[5] = dVar2;
            puVar1[6] = uVar8;
            puVar1[7] = dVar3;
          }
        }
        local_64 = local_64 + -1;
        uVar18 = 0;
        iVar4 = SUB84(local_70,0);
        while (queue != (NodeAVL *)0x0) {
          pMVar12 = (MaxRec *)avlFindAndDeleteMin(&queue);
          if (pMVar12->isUsed != 0) {
            pMVar12->wasMin = 1;
            iVar10 = pMVar12->imgIdx;
            lVar16 = (long)iVar10;
            dVar2 = *(double *)(&local_78->numMaxs + lVar16 * 2);
            if (pMVar12->sumVals < dVar2) {
              *(double *)(&local_78->numMaxs + lVar16 * 2) = pMVar12->sumVals;
              pvVar5 = pMVar12->back;
              uVar6 = *(undefined8 *)&pMVar12->isUsed;
              pNVar13 = pMVar12->qPtr;
              uVar7 = *(undefined8 *)&pMVar12->imgIdx;
              dVar3 = pMVar12->sumVals;
              uVar8 = *(undefined8 *)&pMVar12->numVals;
              dVar9 = pMVar12->vals[0];
              uVar18 = uVar18 + (99999999.99999999 < dVar2);
              puVar1 = (undefined8 *)((long)local_58 + lVar16 * 0x40);
              *puVar1 = pMVar12->next;
              puVar1[1] = pvVar5;
              puVar1[2] = uVar6;
              puVar1[3] = pNVar13;
              puVar1[4] = uVar7;
              puVar1[5] = dVar3;
              puVar1[6] = uVar8;
              puVar1[7] = dVar9;
              if (uVar18 == local_50) break;
            }
            if ((-1 < dstPix) &&
               (*(double *)(&local_78->numMaxs + (ulong)(uint)dstPix * 2) < 100000000.0)) break;
            local_68 = iVar10 / SUB84(local_70,0);
            iVar15 = iVar10 % SUB84(local_70,0);
            local_60 = lVar16;
            local_4c = uVar18;
            if (0 < iVar15) {
              addPathToNodeAVL(this,pMVar12,iVar10 + -1,local_48[lVar16 + -1],numDistMaxs,maxs,
                               &queue);
            }
            if (iVar15 < iVar4 + -1) {
              addPathToNodeAVL(this,pMVar12,(int)local_60 + 1,local_48[local_60],numDistMaxs,maxs,
                               &queue);
            }
            uVar18 = local_4c;
            if (0 < local_68) {
              iVar10 = (int)local_60 - local_70._0_4_;
              addPathToNodeAVL(this,pMVar12,iVar10,local_40[iVar10],numDistMaxs,maxs,&queue);
            }
            if (local_68 < local_64) {
              addPathToNodeAVL(this,pMVar12,(int)local_60 + SUB84(local_70,0),local_40[local_60],
                               numDistMaxs,maxs,&queue);
            }
          }
        }
        pvVar5 = local_58;
        uVar18 = -dstPix;
        if (0 < dstPix) {
          uVar18 = dstPix;
        }
        uVar11 = (ulong)uVar18;
        dVar2 = *(double *)(&local_78->numMaxs + uVar11 * 2);
        if (maxVector != (double *)0x0) {
          pMVar12 = maxs[uVar11];
          auVar19 = ZEXT864((ulong)pMVar12->sumVals);
          uVar18 = pMVar12->numVals;
          for (uVar17 = 0; (~((int)uVar18 >> 0x1f) & uVar18) != uVar17; uVar17 = uVar17 + 1) {
            maxVector[uVar17] = pMVar12->vals[uVar17];
          }
          while (pMVar12 = (MaxRec *)pMVar12->next, pMVar12 != (MaxRec *)0x0) {
            dVar3 = pMVar12->sumVals;
            if (dVar3 < auVar19._0_8_) {
              uVar18 = pMVar12->numVals;
              for (uVar17 = 0; (~((int)uVar18 >> 0x1f) & uVar18) != uVar17; uVar17 = uVar17 + 1) {
                maxVector[uVar17] = pMVar12->vals[uVar17];
              }
              auVar19 = ZEXT864((ulong)dVar3);
            }
          }
        }
        if (backPtrs != (int *)0x0) {
          uVar17 = 0;
          for (pvVar14 = (void *)((long)local_58 + uVar11 * 0x40); pvVar14 != (void *)0x0;
              pvVar14 = *(void **)((long)pvVar14 + 8)) {
            backPtrs[uVar17] = *(int *)((long)pvVar14 + 0x20);
            uVar17 = uVar17 + 1;
          }
          backPtrs[uVar17 & 0xffffffff] = -1;
        }
        while (uVar11 = local_38, queue != (NodeAVL *)0x0) {
          backPtrs = (int *)&queue;
          avlFindAndDeleteMin((NodeAVL **)&queue);
        }
        for (uVar17 = 0; uVar11 != uVar17; uVar17 = uVar17 + 1) {
          freeMaxRecs((KMaxDistance *)backPtrs,maxs[uVar17]);
        }
        free(maxs);
        free(queue);
        free(pvVar5);
        return dVar2;
      }
      __ptr = "ERROR: no source points found.\n";
      sStack_a0 = 0x1f;
    }
  }
  else {
    __ptr = "ERROR: numDistMaxs is too big (increase MAX_NUM_MAXS).\n";
    sStack_a0 = 0x37;
  }
  fwrite(__ptr,sStack_a0,1,_stderr);
  return 0.0;
}

Assistant:

double KMaxDistance::compute( const double *xEdgeCosts, const double *yEdgeCosts, const int width, const int height, const int numDistMaxs,
    const int *srcPixs, const int numSrcPixs, const int dstPix, double *dists, int* backPtrs, double *maxVector ){

    if ( numDistMaxs > MAX_NUM_MAXS ){ fprintf(stderr, "ERROR: numDistMaxs is too big (increase MAX_NUM_MAXS).\n" ); return 0.0; }
    if ( numDistMaxs < 1 ){ fprintf(stderr, "ERROR: numDistMaxs has to be positive.\n" ); return 0.0; }
    if ( numSrcPixs < 1 ){ fprintf(stderr, "ERROR: no source points found.\n" ); return 0.0; }

    numMaxRecs = 0;
    numMaxRecsInOneNode = 0;
    numDistMaxsGl = numDistMaxs;

	int cnt = 0;
    //double *dists;
    if ( dists == NULL ) dists = (double*)malloc( width*height*sizeof( dists[0] )); // else dists = distsExt; 
    MaxRec **maxs = (MaxRec**)malloc( width*height*sizeof( maxs[0] ));
    MaxRec* prevPtrs = (MaxRec*)malloc( width*height*sizeof( prevPtrs[0] ));
    
    for ( int i = 0; i < width*height; ++i ) 
    {
		maxs[i] = NULL;
		dists[i] = MAX_GEO_DIST;
	}

    NodeAVL *queue = NULL;

    for ( int i = 0; i < numSrcPixs; ++i ){
        int imgIdx = srcPixs[i];
        MaxRec *rec = createNewMaxRec( imgIdx, numDistMaxs );
        rec->wasMin = 1;
        rec->qPtr = avlInsert( &queue, 0.0, rec );
        maxs[imgIdx] = rec;
        if ( prevPtrs != NULL ) prevPtrs[imgIdx] = *rec;
    }

	
    while ( queue != NULL )
    {

        MaxRec *minDistRec = (MaxRec*)avlFindAndDeleteMin( &queue );

        if ( !minDistRec->isUsed ) continue;
        
        minDistRec->wasMin = 1;
        int imgIdx = minDistRec->imgIdx;
        
        if ( minDistRec->sumVals < dists[imgIdx] ){ 
            if ( dists[imgIdx] > MAX_GEO_DIST - GEO_MAX_EPSX ) cnt++;
            dists[imgIdx] = minDistRec->sumVals;
            prevPtrs[imgIdx] = *minDistRec;
            if ( cnt == width*height ) break;
        }
        
        if ( dstPix >= 0 ){ if ( dists[dstPix] < MAX_GEO_DIST ) break; }
        
        int y = imgIdx/width, x = imgIdx - y*width;
        if ( x > 0 )        addPathToNodeAVL( minDistRec,     imgIdx-1,     xEdgeCosts[imgIdx-1], numDistMaxs, maxs, &queue );
        if ( x < width-1 )  addPathToNodeAVL( minDistRec,     imgIdx+1,       xEdgeCosts[imgIdx], numDistMaxs, maxs, &queue );
        if ( y > 0 )        addPathToNodeAVL( minDistRec, imgIdx-width, yEdgeCosts[imgIdx-width], numDistMaxs, maxs, &queue );
        if ( y < height-1 ) addPathToNodeAVL( minDistRec, imgIdx+width,       yEdgeCosts[imgIdx], numDistMaxs, maxs, &queue );

    }


    double retVal = 0.0;
    retVal = dists[abs(dstPix)];

    if ( maxVector != NULL ) 
    {
        MaxRec* m = maxs[abs(dstPix)];
        double minSum = m->sumVals;
        for(int i = 0; i < m->numVals; i++) maxVector[i] = m->vals[i];

        while(m->next != NULL)
        {
            m = (MaxRec*) m->next;
            if(m->sumVals < minSum)
            {
                minSum = m->sumVals;
                for(int i = 0; i < m->numVals; i++) maxVector[i] = m->vals[i];
            }
        }
    }

    if ( backPtrs != NULL ) 
    {
        int backIdx = 0;
        MaxRec* backRec = &prevPtrs[abs(dstPix)];
        while(backRec != NULL)
        {
            backPtrs[backIdx++] = backRec->imgIdx;
            backRec = (MaxRec*) backRec->back;
        }
        backPtrs[backIdx++] = -1;
    }
    
    while ( queue != NULL ) avlFindAndDeleteMin( &queue );
    
    #ifdef DEBUG_MODE
    meanNumRecs = (double)numMaxRecs/(double)(width*height);
    maxNumRecsInNode = numMaxRecsInOneNode;
    printf("meanNumRecs: %.2lf\n", meanNumRecs);
    printf("maxNumRecsInNode: %d\n", maxNumRecsInNode);
    #endif

    for ( int i = 0; i < width*height; ++i ) freeMaxRecs( maxs[i] );
    free( maxs ); 
    free( queue );
    free( prevPtrs );
    //if ( distsExt == NULL ) free( dists );

    return retVal;

}